

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHelper.cc
# Opt level: O3

void OpenMesh::IO::write_float(float _f,FILE *_out,bool _swap)

{
  undefined7 in_register_00000031;
  float local_c [2];
  u3 fc;
  
  local_c[0] = _f;
  if ((int)CONCAT71(in_register_00000031,_swap) != 0) {
    local_c[0] = (float)((uint)_f >> 0x18 | ((uint)_f & 0xff0000) >> 8 | ((uint)_f & 0xff00) << 8 |
                        (int)_f << 0x18);
  }
  fwrite(local_c,1,4,(FILE *)_out);
  return;
}

Assistant:

void write_float(float _f, FILE* _out, bool _swap)
{
  union u3 { float f; unsigned char c[4]; } fc;
  fc.f = _f;
  if (_swap) {
    std::swap(fc.c[0], fc.c[3]);
    std::swap(fc.c[1], fc.c[2]);
  }
  fwrite((char*)fc.c, 1, 4, _out);
}